

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O2

int __thiscall QtMWidgets::TableViewCellPrivate::init(TableViewCellPrivate *this,EVP_PKEY_CTX *ctx)

{
  TableViewCell *pTVar1;
  undefined8 uVar2;
  int iVar3;
  QPalette *this_00;
  QColor *pQVar4;
  TableViewCellLayout *this_01;
  MinimumSizeLabel *this_02;
  TextLabel *pTVar5;
  QWidget *pQVar6;
  QFont f;
  QTextOption opt;
  
  pTVar1 = this->q;
  FingerGeometry::height();
  QWidget::setMinimumHeight((int)pTVar1);
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->q,0));
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  this_00 = (QPalette *)QWidget::palette();
  pQVar4 = QPalette::color(this_00,Highlight);
  uVar2 = *(undefined8 *)((long)&pQVar4->ct + 2);
  *(undefined8 *)&this->highlightColor = *(undefined8 *)pQVar4;
  *(undefined8 *)((long)&(this->highlightColor).ct + 2) = uVar2;
  QColor::setAlpha((int)this + 0x38);
  this_01 = (TableViewCellLayout *)operator_new(0x40);
  TableViewCellLayout::TableViewCellLayout(this_01,&this->q->super_QWidget);
  this->layout = this_01;
  QLayout::setContentsMargins((int)this_01,3,3,3);
  this_02 = (MinimumSizeLabel *)operator_new(0x28);
  MinimumSizeLabel::MinimumSizeLabel(this_02,&this->q->super_QWidget);
  this->imageLabel = this_02;
  QLabel::setAlignment(this_02,0x84);
  QLabel::setWordWrap(SUB81(this->imageLabel,0));
  this->layout->imageLabel = this->imageLabel;
  QLayout::update();
  pTVar5 = (TextLabel *)operator_new(0x30);
  TextLabel::TextLabel(pTVar5,&this->q->super_QWidget,(WindowFlags)0x0);
  this->textLabel = pTVar5;
  TextLabel::textOption((TextLabel *)&opt);
  opt = (QTextOption)((byte)opt | 0x80);
  TextLabel::setTextOption(this->textLabel,&opt);
  this->layout->textLabel = this->textLabel;
  QLayout::update();
  QTextOption::~QTextOption(&opt);
  pTVar5 = (TextLabel *)operator_new(0x30);
  TextLabel::TextLabel(pTVar5,&this->q->super_QWidget,(WindowFlags)0x0);
  this->detailedTextLabel = pTVar5;
  QFont::QFont(&f,(QFont *)(*(long *)&pTVar5->field_0x20 + 0x38));
  QFont::pointSize();
  QFont::setPointSize((int)&f);
  TextLabel::setFont(this->detailedTextLabel,&f);
  TextLabel::textOption((TextLabel *)&opt);
  opt = (QTextOption)((byte)opt | 0x80);
  TextLabel::setTextOption(this->detailedTextLabel,&opt);
  this->layout->detailedTextLabel = this->detailedTextLabel;
  QLayout::update();
  QTextOption::~QTextOption(&opt);
  QFont::~QFont(&f);
  pQVar6 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar6,this->q,0);
  this->accessoryWidget = pQVar6;
  this->layout->accessoryWidget = pQVar6;
  iVar3 = QLayout::update();
  return iVar3;
}

Assistant:

void
TableViewCellPrivate::init()
{
	q->setMinimumHeight( FingerGeometry::height() );
	q->setSizePolicy( QSizePolicy::Minimum, QSizePolicy::Fixed );
	q->setBackgroundRole( QPalette::Base );
	q->setAutoFillBackground( true );

	highlightColor = q->palette().color( QPalette::Highlight );
	highlightColor.setAlpha( 75 );


	layout = new TableViewCellLayout( q );
	layout->setContentsMargins( 3, 3, 3, 3 );

	imageLabel = new MinimumSizeLabel( q );
	imageLabel->setAlignment( Qt::AlignCenter );
	imageLabel->setWordWrap( true );
	layout->setImageLabel( imageLabel );

	{
		textLabel = new TextLabel( q );
		QTextOption opt = textLabel->textOption();
		opt.setAlignment( Qt::AlignVCenter | opt.alignment() );
		textLabel->setTextOption( opt );
		layout->setTextLabel( textLabel );
	}

	{
		detailedTextLabel = new TextLabel( q );
		QFont f = detailedTextLabel->font();
		f.setPointSize( qMax( f.pointSize() - 1, 5 ) );
		detailedTextLabel->setFont( f );
		QTextOption opt = detailedTextLabel->textOption();
		opt.setAlignment( Qt::AlignVCenter | opt.alignment() );
		detailedTextLabel->setTextOption( opt );
		layout->setDetailedTextLabel( detailedTextLabel );
	}

	accessoryWidget = new QWidget( q );
	layout->setAccessoryWidget( accessoryWidget );
}